

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Vec_IntLits2Vars(Vec_Int_t *p,int Shift)

{
  int iVar1;
  int local_18;
  int i;
  int Shift_local;
  Vec_Int_t *p_local;
  
  for (local_18 = 0; local_18 < p->nSize; local_18 = local_18 + 1) {
    iVar1 = Abc_Lit2Var(p->pArray[local_18]);
    p->pArray[local_18] = iVar1 + Shift;
  }
  return;
}

Assistant:

static inline void Vec_IntLits2Vars( Vec_Int_t * p, int Shift )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Abc_Lit2Var( p->pArray[i] ) + Shift;
}